

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  Value *pVVar1;
  TValue *io2;
  TValue *io1;
  StkId pos;
  char *name;
  lua_Debug *plStack_18;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  name._4_4_ = n;
  plStack_18 = ar;
  ar_local = (lua_Debug *)L;
  if (ar == (lua_Debug *)0x0) {
    if (*(char *)((L->top).offset + -8) == 'F') {
      pos = (StkId)luaF_getlocalname(*(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18),n,0);
    }
    else {
      pos = (StkId)0x0;
    }
  }
  else {
    io1 = (TValue *)0x0;
    pos = (StkId)luaG_findlocal(L,ar->i_ci,n,(StkId *)&io1);
    if (pos != (StkId)0x0) {
      pVVar1 = (Value *)ar_local->namewhat;
      *pVVar1 = io1->value_;
      (&pVVar1->ub)[8] = io1->tt_;
      ar_local->namewhat = ar_local->namewhat + 0x10;
    }
  }
  return (char *)pos;
}

Assistant:

LUA_API const char *lua_getlocal (lua_State *L, const lua_Debug *ar, int n) {
  const char *name;
  lua_lock(L);
  if (ar == NULL) {  /* information about non-active function? */
    if (!isLfunction(s2v(L->top.p - 1)))  /* not a Lua function? */
      name = NULL;
    else  /* consider live variables at function start (parameters) */
      name = luaF_getlocalname(clLvalue(s2v(L->top.p - 1))->p, n, 0);
  }
  else {  /* active function; get information through 'ar' */
    StkId pos = NULL;  /* to avoid warnings */
    name = luaG_findlocal(L, ar->i_ci, n, &pos);
    if (name) {
      setobjs2s(L, L->top.p, pos);
      api_incr_top(L);
    }
  }
  lua_unlock(L);
  return name;
}